

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int g_write(lua_State *L,FILE *f,int arg)

{
  int iVar1;
  size_t in_RAX;
  char *__ptr;
  size_t sVar2;
  int iVar3;
  uint i;
  size_t l;
  
  iVar3 = (int)((ulong)((long)L->top - (long)L->base) >> 4);
  i = 1;
  l = in_RAX;
  do {
    iVar3 = iVar3 + -1;
    if (iVar3 == 0) {
      iVar3 = pushresult(L,i,(char *)0x0);
      return iVar3;
    }
    iVar1 = lua_type(L,arg);
    if (iVar1 == 3) {
      if (i == 0) {
LAB_0010f6ce:
        i = 0;
      }
      else {
        lua_tonumber(L,arg);
        iVar1 = fprintf((FILE *)f,"%.14g");
        i = (uint)(0 < iVar1);
      }
    }
    else {
      __ptr = luaL_checklstring(L,arg,&l);
      if (i == 0) goto LAB_0010f6ce;
      sVar2 = fwrite(__ptr,1,l,(FILE *)f);
      i = (uint)(sVar2 == l);
    }
    arg = arg + 1;
  } while( true );
}

Assistant:

static int g_write(lua_State*L,FILE*f,int arg){
int nargs=lua_gettop(L)-1;
int status=1;
for(;nargs--;arg++){
if(lua_type(L,arg)==3){
status=status&&
fprintf(f,"%.14g",lua_tonumber(L,arg))>0;
}
else{
size_t l;
const char*s=luaL_checklstring(L,arg,&l);
status=status&&(fwrite(s,sizeof(char),l,f)==l);
}
}
return pushresult(L,status,NULL);
}